

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O0

BackgroundParser * BackgroundParser::New(ScriptContext *scriptContext)

{
  HeapAllocator *alloc;
  BackgroundParser *this;
  TrackAllocData local_38;
  ScriptContext *local_10;
  ScriptContext *scriptContext_local;
  
  local_10 = scriptContext;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BackgroundParser.cpp"
             ,0x2f);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_38);
  this = (BackgroundParser *)new<Memory::HeapAllocator>(0x78,alloc,0x350bd0);
  BackgroundParser(this,local_10);
  return this;
}

Assistant:

BackgroundParser * BackgroundParser::New(Js::ScriptContext *scriptContext)
{
    return HeapNew(BackgroundParser, scriptContext);
}